

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twosided_exponential_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::twosided_exponential_dist<float>::icdf
          (twosided_exponential_dist<float> *this,result_type_conflict1 x)

{
  int *piVar1;
  param_type *in_RDI;
  float in_XMM0_Da;
  result_type_conflict1 rVar2;
  undefined4 local_24;
  undefined4 local_4;
  
  if ((in_XMM0_Da < 0.0) || (1.0 < in_XMM0_Da)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    local_4 = std::numeric_limits<float>::quiet_NaN();
  }
  else if ((in_XMM0_Da != 1.0) || (NAN(in_XMM0_Da))) {
    if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
      if (0.5 <= in_XMM0_Da) {
        rVar2 = param_type::mu(in_RDI);
        local_24 = math::ln(0.0);
        local_24 = -rVar2 * local_24;
      }
      else {
        rVar2 = param_type::mu(in_RDI);
        local_24 = math::ln(0.0);
        local_24 = rVar2 * local_24;
      }
      local_4 = local_24;
    }
    else {
      local_4 = std::numeric_limits<float>::infinity();
      local_4 = -local_4;
    }
  }
  else {
    local_4 = std::numeric_limits<float>::infinity();
  }
  return local_4;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      if (x == 0)
        return -math::numeric_limits<result_type>::infinity();
      return x < math::constants<result_type>::one_half ? P.mu() * math::ln(2 * x)
                                                        : -P.mu() * math::ln(2 - 2 * x);
    }